

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpc.c
# Opt level: O1

mpc_val_t * mpcaf_grammar_repeat(int n,mpc_val_t **xs)

{
  byte bVar1;
  undefined4 uVar2;
  byte *__ptr;
  undefined8 *puVar3;
  mpc_val_t *pmVar4;
  
  __ptr = (byte *)xs[1];
  if (__ptr == (byte *)0x0) {
    return *xs;
  }
  bVar1 = *__ptr;
  if (bVar1 < 0x2b) {
    if (bVar1 == 0x21) {
      free(__ptr);
      pmVar4 = *xs;
      puVar3 = (undefined8 *)calloc(1,0x38);
      *puVar3 = 0;
      *(undefined2 *)(puVar3 + 6) = 0x12;
      puVar3[1] = pmVar4;
      puVar3[2] = mpc_ast_delete;
LAB_0010820b:
      puVar3[3] = mpcf_ctor_null;
      return puVar3;
    }
    if (bVar1 != 0x2a) {
LAB_00108193:
      uVar2 = *(undefined4 *)__ptr;
      free(__ptr);
      pmVar4 = *xs;
      puVar3 = (undefined8 *)calloc(1,0x38);
      *puVar3 = 0;
      *(undefined2 *)(puVar3 + 6) = 0x16;
      *(undefined4 *)(puVar3 + 1) = uVar2;
      puVar3[2] = mpcf_fold_ast;
      puVar3[3] = pmVar4;
      puVar3[4] = mpc_ast_delete;
      return puVar3;
    }
    free(__ptr);
    pmVar4 = *xs;
    puVar3 = (undefined8 *)calloc(1,0x38);
    *puVar3 = 0;
    *(undefined2 *)(puVar3 + 6) = 0x14;
  }
  else {
    if (bVar1 != 0x2b) {
      if (bVar1 != 0x3f) goto LAB_00108193;
      free(__ptr);
      pmVar4 = *xs;
      puVar3 = (undefined8 *)calloc(1,0x38);
      *puVar3 = 0;
      *(undefined2 *)(puVar3 + 6) = 0x13;
      puVar3[1] = pmVar4;
      goto LAB_0010820b;
    }
    free(__ptr);
    pmVar4 = *xs;
    puVar3 = (undefined8 *)calloc(1,0x38);
    *puVar3 = 0;
    *(undefined2 *)(puVar3 + 6) = 0x15;
  }
  puVar3[3] = pmVar4;
  puVar3[2] = mpcf_fold_ast;
  return puVar3;
}

Assistant:

static mpc_val_t *mpcaf_grammar_repeat(int n, mpc_val_t **xs) {
  int num;
  (void) n;
  if (xs[1] == NULL) { return xs[0]; }
  switch(((char*)xs[1])[0])
  {
    case '*': { free(xs[1]); return mpca_many(xs[0]); }; break;
    case '+': { free(xs[1]); return mpca_many1(xs[0]); }; break;
    case '?': { free(xs[1]); return mpca_maybe(xs[0]); }; break;
    case '!': { free(xs[1]); return mpca_not(xs[0]); }; break;
    default:
      num = *((int*)xs[1]);
      free(xs[1]);
  }
  return mpca_count(num, xs[0]);
}